

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O2

string * fs_get_owner_group_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  int iVar1;
  int *piVar2;
  group *pgVar3;
  string_view fname;
  stat sStack_1a8;
  statx sx;
  
  iVar1 = statx(0xffffffffffffff9c,path._M_str,0x800,0x10,&sx);
  if (((iVar1 == 0) ||
      ((piVar2 = __errno_location(), *piVar2 == 0x26 &&
       (iVar1 = stat(path._M_str,&sStack_1a8), sx.stx_gid = sStack_1a8.st_gid, iVar1 == 0)))) &&
     (pgVar3 = getgrgid(sx.stx_gid), pgVar3 != (group *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pgVar3->gr_name,(allocator<char> *)&sx);
  }
  else {
    fname._M_str = "fs_get_owner_group";
    fname._M_len = 0x12;
    fs_print_error(path,fname);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_group(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, true); !s.empty())
    return s;
#else
  if (auto gid = fs_stat_gid(path)) {
    if (auto gr = getgrgid(gid.value()))
      return gr->gr_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}